

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> * __thiscall
argstest::Command::GetAllFlags
          (vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>
           *__return_storage_ptr__,Command *this)

{
  bool bVar1;
  uint uVar2;
  Options OVar3;
  vector<argstest::Base_*,_std::allocator<argstest::Base_*>_> *this_00;
  reference ppBVar4;
  iterator iVar5;
  iterator iVar6;
  __normal_iterator<argstest::FlagBase_**,_std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>_>
  local_f8;
  const_iterator local_f0;
  undefined1 local_e8 [8];
  vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> childFlags_2;
  __normal_iterator<argstest::FlagBase_**,_std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>_>
  local_b8;
  const_iterator local_b0;
  undefined1 local_a8 [8];
  vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> childFlags_1;
  __normal_iterator<argstest::FlagBase_**,_std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>_>
  local_78;
  const_iterator local_70;
  undefined1 local_58 [8];
  vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> childFlags;
  Base *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<argstest::Base_*,_std::allocator<argstest::Base_*>_> *__range2;
  Command *this_local;
  vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> *res;
  
  std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::vector
            (__return_storage_ptr__);
  uVar2 = (*(this->super_Group).super_Base._vptr_Base[2])();
  if ((uVar2 & 1) != 0) {
    this_00 = Group::Children(&this->super_Group);
    __end2 = std::vector<argstest::Base_*,_std::allocator<argstest::Base_*>_>::begin(this_00);
    child = (Base *)std::vector<argstest::Base_*,_std::allocator<argstest::Base_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<argstest::Base_*const_*,_std::vector<argstest::Base_*,_std::allocator<argstest::Base_*>_>_>
                                       *)&child), bVar1) {
      ppBVar4 = __gnu_cxx::
                __normal_iterator<argstest::Base_*const_*,_std::vector<argstest::Base_*,_std::allocator<argstest::Base_*>_>_>
                ::operator*(&__end2);
      childFlags.super__Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppBVar4;
      if (this->selectedCommand == (Command *)0x0) {
LAB_0024e08b:
        (*(code *)((*childFlags.
                     super__Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_NamedBase).
                  super_Base.errorMsg.field_2._M_allocated_capacity)(local_58);
        local_78._M_current =
             (FlagBase **)
             std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::end
                       (__return_storage_ptr__);
        __gnu_cxx::
        __normal_iterator<argstest::FlagBase*const*,std::vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>>>
        ::__normal_iterator<argstest::FlagBase**>
                  ((__normal_iterator<argstest::FlagBase*const*,std::vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>>>
                    *)&local_70,&local_78);
        iVar5 = std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::begin
                          ((vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> *)
                           local_58);
        iVar6 = std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::end
                          ((vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> *)
                           local_58);
        childFlags_1.super__Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>>::
                      insert<__gnu_cxx::__normal_iterator<argstest::FlagBase**,std::vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>>>,void>
                                ((vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>> *)
                                 __return_storage_ptr__,local_70,
                                 (__normal_iterator<argstest::FlagBase_**,_std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>_>
                                  )iVar5._M_current,
                                 (__normal_iterator<argstest::FlagBase_**,_std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>_>
                                  )iVar6._M_current);
        std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::~vector
                  ((vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> *)local_58);
      }
      else {
        OVar3 = Base::GetOptions((Base *)childFlags.
                                         super__Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        OVar3 = operator&(OVar3,Global);
        if (OVar3 != None) goto LAB_0024e08b;
      }
      __gnu_cxx::
      __normal_iterator<argstest::Base_*const_*,_std::vector<argstest::Base_*,_std::allocator<argstest::Base_*>_>_>
      ::operator++(&__end2);
    }
    if (this->selectedCommand != (Command *)0x0) {
      (*(this->selectedCommand->super_Group).super_Base._vptr_Base[9])(local_a8);
      local_b8._M_current =
           (FlagBase **)
           std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::end
                     (__return_storage_ptr__);
      __gnu_cxx::
      __normal_iterator<argstest::FlagBase*const*,std::vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>>>
      ::__normal_iterator<argstest::FlagBase**>
                ((__normal_iterator<argstest::FlagBase*const*,std::vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>>>
                  *)&local_b0,&local_b8);
      iVar5 = std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::begin
                        ((vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> *)
                         local_a8);
      iVar6 = std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::end
                        ((vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> *)
                         local_a8);
      childFlags_2.super__Vector_base<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>>::
                    insert<__gnu_cxx::__normal_iterator<argstest::FlagBase**,std::vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>>>,void>
                              ((vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>> *)
                               __return_storage_ptr__,local_b0,
                               (__normal_iterator<argstest::FlagBase_**,_std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>_>
                                )iVar5._M_current,
                               (__normal_iterator<argstest::FlagBase_**,_std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>_>
                                )iVar6._M_current);
      std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::~vector
                ((vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> *)local_a8);
    }
    if (this->subparser != (Subparser *)0x0) {
      (*(this->subparser->super_Group).super_Base._vptr_Base[9])(local_e8);
      local_f8._M_current =
           (FlagBase **)
           std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::end
                     (__return_storage_ptr__);
      __gnu_cxx::
      __normal_iterator<argstest::FlagBase*const*,std::vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>>>
      ::__normal_iterator<argstest::FlagBase**>
                ((__normal_iterator<argstest::FlagBase*const*,std::vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>>>
                  *)&local_f0,&local_f8);
      iVar5 = std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::begin
                        ((vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> *)
                         local_e8);
      iVar6 = std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::end
                        ((vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> *)
                         local_e8);
      std::vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>>::
      insert<__gnu_cxx::__normal_iterator<argstest::FlagBase**,std::vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>>>,void>
                ((vector<argstest::FlagBase*,std::allocator<argstest::FlagBase*>> *)
                 __return_storage_ptr__,local_f0,
                 (__normal_iterator<argstest::FlagBase_**,_std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>_>
                  )iVar5._M_current,
                 (__normal_iterator<argstest::FlagBase_**,_std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>_>
                  )iVar6._M_current);
      std::vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_>::~vector
                ((vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> *)local_e8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<FlagBase*> GetAllFlags() override
            {
                std::vector<FlagBase*> res;

                if (!Matched())
                {
                    return res;
                }

                for (auto *child: Children())
                {
                    if (selectedCommand == nullptr || (child->GetOptions() & Options::Global) != Options::None)
                    {
                        auto childFlags = child->GetAllFlags();
                        res.insert(res.end(), childFlags.begin(), childFlags.end());
                    }
                }

                if (selectedCommand != nullptr)
                {
                    auto childFlags = selectedCommand->GetAllFlags();
                    res.insert(res.end(), childFlags.begin(), childFlags.end());
                }

                if (subparser != nullptr)
                {
                    auto childFlags = subparser->GetAllFlags();
                    res.insert(res.end(), childFlags.begin(), childFlags.end());
                }

                return res;
            }